

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O2

void __thiscall
cmGeneratorExpressionParser::Parse
          (cmGeneratorExpressionParser *this,
          vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
          *result)

{
  pointer pcVar1;
  
  pcVar1 = (this->Tokens).
           super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->it)._M_current = pcVar1;
  while (pcVar1 != (this->Tokens).
                   super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
    ParseContent(this,result);
    pcVar1 = (this->it)._M_current;
  }
  return;
}

Assistant:

void cmGeneratorExpressionParser::Parse(
  std::vector<cmGeneratorExpressionEvaluator*>& result)
{
  it = this->Tokens.begin();

  while (this->it != this->Tokens.end()) {
    this->ParseContent(result);
  }
}